

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase68::run(TestCase68 *this)

{
  bool bVar1;
  uint uVar2;
  HttpHeaderTable *pHVar3;
  NullableValue<kj::HttpHeaderId> *pNVar4;
  HttpHeaderId *pHVar5;
  HttpHeaderId *extraout_RDX;
  HttpHeaderId *extraout_RDX_00;
  HttpHeaderId *extraout_RDX_01;
  HttpHeaderId *extraout_RDX_02;
  HttpHeaderId *extraout_RDX_03;
  HttpHeaderId *extraout_RDX_04;
  HttpHeaderId *extraout_RDX_05;
  HttpHeaderId *extraout_RDX_06;
  HttpHeaderId *extraout_RDX_07;
  HttpHeaderId *extraout_RDX_08;
  HttpHeaderId *extraout_RDX_09;
  HttpHeaderId *extraout_RDX_10;
  HttpHeaderId *extraout_RDX_11;
  HttpHeaderId *extraout_RDX_12;
  HttpHeaderId *extraout_RDX_13;
  HttpHeaderId HVar6;
  bool local_4a9;
  undefined1 auStack_4a8 [7];
  bool _kj_shouldLog_20;
  Maybe<kj::HttpHeaderId> local_498;
  bool local_479;
  undefined1 auStack_478 [7];
  bool _kj_shouldLog_19;
  Maybe<kj::HttpHeaderId> local_468;
  bool local_449;
  bool _kj_shouldLog_18;
  ArrayPtr<const_char> local_440;
  Maybe<kj::HttpHeaderId> local_430;
  undefined1 local_418 [8];
  NullableValue<kj::HttpHeaderId> _kj_result_3;
  bool local_3e1;
  bool _kj_shouldLog_17;
  ArrayPtr<const_char> local_3d8;
  Maybe<kj::HttpHeaderId> local_3c8;
  undefined1 local_3b0 [8];
  NullableValue<kj::HttpHeaderId> _kj_result_2;
  bool local_379;
  bool _kj_shouldLog_16;
  ArrayPtr<const_char> local_370;
  Maybe<kj::HttpHeaderId> local_360;
  undefined1 local_348 [8];
  NullableValue<kj::HttpHeaderId> _kj_result_1;
  bool local_311;
  bool _kj_shouldLog_15;
  ArrayPtr<const_char> local_308;
  Maybe<kj::HttpHeaderId> local_2f8;
  undefined1 local_2e0 [8];
  NullableValue<kj::HttpHeaderId> _kj_result;
  bool local_2a9;
  undefined1 local_2a8 [7];
  bool _kj_shouldLog_14;
  HttpHeaderTable *local_298;
  uint uStack_290;
  ArrayPtr<const_char> local_280;
  bool local_269;
  undefined1 local_268 [7];
  bool _kj_shouldLog_13;
  undefined8 local_258;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  ArrayPtr<const_char> local_240;
  bool local_229;
  undefined1 local_228 [7];
  bool _kj_shouldLog_12;
  String local_218;
  bool local_1f9;
  undefined1 local_1f8 [7];
  bool _kj_shouldLog_11;
  String local_1e8;
  bool local_1c9;
  undefined1 local_1c8 [7];
  bool _kj_shouldLog_10;
  String local_1b8;
  bool local_199;
  undefined1 local_198 [7];
  bool _kj_shouldLog_9;
  String local_188;
  bool local_169;
  undefined1 local_168 [7];
  bool _kj_shouldLog_8;
  String local_158;
  bool local_13c;
  bool local_13b;
  bool local_13a;
  bool local_139;
  bool local_138;
  bool local_137;
  bool local_136;
  bool local_135;
  bool _kj_shouldLog_7;
  bool _kj_shouldLog_6;
  bool _kj_shouldLog_5;
  bool _kj_shouldLog_4;
  bool _kj_shouldLog_3;
  bool _kj_shouldLog_2;
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  uint builtinHeaderCount;
  Own<kj::HttpHeaderTable> table;
  ArrayPtr<const_char> local_110;
  undefined1 local_100 [8];
  HttpHeaderId bazQux2;
  ArrayPtr<const_char> local_e0;
  undefined1 local_d0 [8];
  HttpHeaderId bazQux;
  ArrayPtr<const_char> local_b0;
  undefined1 auStack_a0 [8];
  HttpHeaderId fooBar;
  ArrayPtr<const_char> local_80;
  undefined1 local_70 [8];
  HttpHeaderId host2;
  ArrayPtr<const_char> local_40;
  undefined1 local_30 [8];
  HttpHeaderId host;
  Builder builder;
  TestCase68 *this_local;
  
  HttpHeaderTable::Builder::Builder((Builder *)&host.id);
  StringPtr::StringPtr((StringPtr *)&local_40,"Host");
  HVar6 = HttpHeaderTable::Builder::add((Builder *)&host.id,(StringPtr)local_40);
  host2._8_8_ = HVar6.table;
  host.table._0_4_ = HVar6.id;
  local_30 = (undefined1  [8])host2._8_8_;
  StringPtr::StringPtr((StringPtr *)&local_80,"hOsT");
  HVar6 = HttpHeaderTable::Builder::add((Builder *)&host.id,(StringPtr)local_80);
  fooBar._8_8_ = HVar6.table;
  host2.table._0_4_ = HVar6.id;
  local_70 = (undefined1  [8])fooBar._8_8_;
  StringPtr::StringPtr((StringPtr *)&local_b0,"Foo-Bar");
  HVar6 = HttpHeaderTable::Builder::add((Builder *)&host.id,(StringPtr)local_b0);
  bazQux._8_8_ = HVar6.table;
  fooBar.table._0_4_ = HVar6.id;
  auStack_a0 = (undefined1  [8])bazQux._8_8_;
  StringPtr::StringPtr((StringPtr *)&local_e0,"baz-qux");
  HVar6 = HttpHeaderTable::Builder::add((Builder *)&host.id,(StringPtr)local_e0);
  bazQux2._8_8_ = HVar6.table;
  bazQux.table._0_4_ = HVar6.id;
  local_d0 = (undefined1  [8])bazQux2._8_8_;
  StringPtr::StringPtr((StringPtr *)&local_110,"Baz-Qux");
  HVar6 = HttpHeaderTable::Builder::add((Builder *)&host.id,(StringPtr)local_110);
  table.ptr = HVar6.table;
  bazQux2.table._0_4_ = HVar6.id;
  local_100 = (undefined1  [8])table.ptr;
  HttpHeaderTable::Builder::build((Builder *)&_kj_shouldLog_3);
  __kj_shouldLog_7 = 0xf;
  pHVar3 = Own<kj::HttpHeaderTable>::operator->((Own<kj::HttpHeaderTable> *)&_kj_shouldLog_3);
  uVar2 = HttpHeaderTable::idCount(pHVar3);
  if (uVar2 != __kj_shouldLog_7 + 2U) {
    local_135 = _::Debug::shouldLog(ERROR);
    while (local_135 != false) {
      _::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x54,ERROR,"\"failed: expected \" \"table->idCount() == builtinHeaderCount + 2\"",
                 (char (*) [60])"failed: expected table->idCount() == builtinHeaderCount + 2");
      local_135 = false;
    }
  }
  bVar1 = HttpHeaderId::operator==((HttpHeaderId *)local_30,(HttpHeaderId *)&HttpHeaderId::HOST);
  if (!bVar1) {
    local_136 = _::Debug::shouldLog(ERROR);
    while (local_136 != false) {
      _::Debug::log<char_const(&)[44]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x56,ERROR,"\"failed: expected \" \"host == HttpHeaderId::HOST\"",
                 (char (*) [44])"failed: expected host == HttpHeaderId::HOST");
      local_136 = false;
    }
  }
  bVar1 = HttpHeaderId::operator!=((HttpHeaderId *)local_30,(HttpHeaderId *)HttpHeaderId::DATE);
  if (!bVar1) {
    local_137 = _::Debug::shouldLog(ERROR);
    while (local_137 != false) {
      _::Debug::log<char_const(&)[44]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x57,ERROR,"\"failed: expected \" \"host != HttpHeaderId::DATE\"",
                 (char (*) [44])"failed: expected host != HttpHeaderId::DATE");
      local_137 = false;
    }
  }
  bVar1 = HttpHeaderId::operator==((HttpHeaderId *)local_70,(HttpHeaderId *)local_30);
  if (!bVar1) {
    local_138 = _::Debug::shouldLog(ERROR);
    while (local_138 != false) {
      _::Debug::log<char_const(&)[31]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x58,ERROR,"\"failed: expected \" \"host2 == host\"",
                 (char (*) [31])"failed: expected host2 == host");
      local_138 = false;
    }
  }
  bVar1 = HttpHeaderId::operator!=((HttpHeaderId *)local_30,(HttpHeaderId *)auStack_a0);
  if (!bVar1) {
    local_139 = _::Debug::shouldLog(ERROR);
    while (local_139 != false) {
      _::Debug::log<char_const(&)[32]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x5a,ERROR,"\"failed: expected \" \"host != fooBar\"",
                 (char (*) [32])"failed: expected host != fooBar");
      local_139 = false;
    }
  }
  bVar1 = HttpHeaderId::operator!=((HttpHeaderId *)local_30,(HttpHeaderId *)local_d0);
  if (!bVar1) {
    local_13a = _::Debug::shouldLog(ERROR);
    while (local_13a != false) {
      _::Debug::log<char_const(&)[32]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x5b,ERROR,"\"failed: expected \" \"host != bazQux\"",
                 (char (*) [32])"failed: expected host != bazQux");
      local_13a = false;
    }
  }
  bVar1 = HttpHeaderId::operator!=((HttpHeaderId *)auStack_a0,(HttpHeaderId *)local_d0);
  if (!bVar1) {
    local_13b = _::Debug::shouldLog(ERROR);
    while (local_13b != false) {
      _::Debug::log<char_const(&)[34]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x5c,ERROR,"\"failed: expected \" \"fooBar != bazQux\"",
                 (char (*) [34])"failed: expected fooBar != bazQux");
      local_13b = false;
    }
  }
  bVar1 = HttpHeaderId::operator==((HttpHeaderId *)local_d0,(HttpHeaderId *)local_100);
  pHVar5 = extraout_RDX;
  if (!bVar1) {
    local_13c = _::Debug::shouldLog(ERROR);
    pHVar5 = extraout_RDX_00;
    while (local_13c != false) {
      _::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x5d,ERROR,"\"failed: expected \" \"bazQux == bazQux2\"",
                 (char (*) [35])"failed: expected bazQux == bazQux2");
      pHVar5 = extraout_RDX_01;
      local_13c = false;
    }
  }
  str<kj::HttpHeaderId&>(&local_158,(kj *)local_30,pHVar5);
  StringPtr::StringPtr((StringPtr *)local_168,"Host");
  bVar1 = String::operator==(&local_158,(StringPtr *)local_168);
  String::~String(&local_158);
  pHVar5 = extraout_RDX_02;
  if (!bVar1) {
    local_169 = _::Debug::shouldLog(ERROR);
    pHVar5 = extraout_RDX_03;
    while (local_169 != false) {
      _::Debug::log<char_const(&)[41]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x5f,ERROR,"\"failed: expected \" \"kj::str(host) == \\\"Host\\\"\"",
                 (char (*) [41])"failed: expected kj::str(host) == \"Host\"");
      pHVar5 = extraout_RDX_04;
      local_169 = false;
    }
  }
  str<kj::HttpHeaderId&>(&local_188,(kj *)local_70,pHVar5);
  StringPtr::StringPtr((StringPtr *)local_198,"Host");
  bVar1 = String::operator==(&local_188,(StringPtr *)local_198);
  String::~String(&local_188);
  pHVar5 = extraout_RDX_05;
  if (!bVar1) {
    local_199 = _::Debug::shouldLog(ERROR);
    pHVar5 = extraout_RDX_06;
    while (local_199 != false) {
      _::Debug::log<char_const(&)[42]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x60,ERROR,"\"failed: expected \" \"kj::str(host2) == \\\"Host\\\"\"",
                 (char (*) [42])"failed: expected kj::str(host2) == \"Host\"");
      pHVar5 = extraout_RDX_07;
      local_199 = false;
    }
  }
  str<kj::HttpHeaderId&>(&local_1b8,(kj *)auStack_a0,pHVar5);
  StringPtr::StringPtr((StringPtr *)local_1c8,"Foo-Bar");
  bVar1 = String::operator==(&local_1b8,(StringPtr *)local_1c8);
  String::~String(&local_1b8);
  pHVar5 = extraout_RDX_08;
  if (!bVar1) {
    local_1c9 = _::Debug::shouldLog(ERROR);
    pHVar5 = extraout_RDX_09;
    while (local_1c9 != false) {
      _::Debug::log<char_const(&)[46]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x61,ERROR,"\"failed: expected \" \"kj::str(fooBar) == \\\"Foo-Bar\\\"\"",
                 (char (*) [46])"failed: expected kj::str(fooBar) == \"Foo-Bar\"");
      pHVar5 = extraout_RDX_10;
      local_1c9 = false;
    }
  }
  str<kj::HttpHeaderId&>(&local_1e8,(kj *)local_d0,pHVar5);
  StringPtr::StringPtr((StringPtr *)local_1f8,"baz-qux");
  bVar1 = String::operator==(&local_1e8,(StringPtr *)local_1f8);
  String::~String(&local_1e8);
  pHVar5 = extraout_RDX_11;
  if (!bVar1) {
    local_1f9 = _::Debug::shouldLog(ERROR);
    pHVar5 = extraout_RDX_12;
    while (local_1f9 != false) {
      _::Debug::log<char_const(&)[46]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x62,ERROR,"\"failed: expected \" \"kj::str(bazQux) == \\\"baz-qux\\\"\"",
                 (char (*) [46])"failed: expected kj::str(bazQux) == \"baz-qux\"");
      pHVar5 = extraout_RDX_13;
      local_1f9 = false;
    }
  }
  str<kj::HttpHeaderId_const&>(&local_218,(kj *)&HttpHeaderId::HOST,pHVar5);
  StringPtr::StringPtr((StringPtr *)local_228,"Host");
  bVar1 = String::operator==(&local_218,(StringPtr *)local_228);
  String::~String(&local_218);
  if (!bVar1) {
    local_229 = _::Debug::shouldLog(ERROR);
    while (local_229 != false) {
      _::Debug::log<char_const(&)[55]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,99,ERROR,"\"failed: expected \" \"kj::str(HttpHeaderId::HOST) == \\\"Host\\\"\"",
                 (char (*) [55])"failed: expected kj::str(HttpHeaderId::HOST) == \"Host\"");
      local_229 = false;
    }
  }
  pHVar3 = Own<kj::HttpHeaderTable>::operator->((Own<kj::HttpHeaderTable> *)&_kj_shouldLog_3);
  local_258 = 0;
  uStack_250 = 0xc;
  uStack_24c = 0;
  local_240 = (ArrayPtr<const_char>)
              HttpHeaderTable::idToString(pHVar3,(HttpHeaderId)(ZEXT416(0xc) << 0x40));
  StringPtr::StringPtr((StringPtr *)local_268,"Date");
  bVar1 = StringPtr::operator==((StringPtr *)&local_240,(StringPtr *)local_268);
  if (!bVar1) {
    local_269 = _::Debug::shouldLog(ERROR);
    while (local_269 != false) {
      _::Debug::log<char_const(&)[65]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x65,ERROR,
                 "\"failed: expected \" \"table->idToString(HttpHeaderId::DATE) == \\\"Date\\\"\"",
                 (char (*) [65])"failed: expected table->idToString(HttpHeaderId::DATE) == \"Date\""
                );
      local_269 = false;
    }
  }
  pHVar3 = Own<kj::HttpHeaderTable>::operator->((Own<kj::HttpHeaderTable> *)&_kj_shouldLog_3);
  local_298 = (HttpHeaderTable *)auStack_a0;
  uStack_290 = (uint)fooBar.table;
  HVar6.id = (uint)fooBar.table;
  HVar6.table = (HttpHeaderTable *)auStack_a0;
  HVar6._12_4_ = 0;
  local_280 = (ArrayPtr<const_char>)HttpHeaderTable::idToString(pHVar3,HVar6);
  StringPtr::StringPtr((StringPtr *)local_2a8,"Foo-Bar");
  bVar1 = StringPtr::operator==((StringPtr *)&local_280,(StringPtr *)local_2a8);
  if (!bVar1) {
    local_2a9 = _::Debug::shouldLog(ERROR);
    while (local_2a9 != false) {
      _::Debug::log<char_const(&)[56]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x66,ERROR,
                 "\"failed: expected \" \"table->idToString(fooBar) == \\\"Foo-Bar\\\"\"",
                 (char (*) [56])"failed: expected table->idToString(fooBar) == \"Foo-Bar\"");
      local_2a9 = false;
    }
  }
  pHVar3 = Own<kj::HttpHeaderTable>::operator->((Own<kj::HttpHeaderTable> *)&_kj_shouldLog_3);
  StringPtr::StringPtr((StringPtr *)&local_308,"Date");
  HttpHeaderTable::stringToId(&local_2f8,pHVar3,(StringPtr)local_308);
  pNVar4 = _::readMaybe<kj::HttpHeaderId>(&local_2f8);
  _::NullableValue<kj::HttpHeaderId>::NullableValue
            ((NullableValue<kj::HttpHeaderId> *)local_2e0,pNVar4);
  Maybe<kj::HttpHeaderId>::~Maybe(&local_2f8);
  pHVar5 = _::NullableValue::operator_cast_to_HttpHeaderId_((NullableValue *)local_2e0);
  if (pHVar5 == (HttpHeaderId *)0x0) {
    _::Debug::Fault::Fault
              ((Fault *)&stack0xfffffffffffffcf0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x68,FAILED,"table->stringToId(\"Date\") != nullptr","");
    _::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffcf0);
  }
  pNVar4 = mv<kj::_::NullableValue<kj::HttpHeaderId>>((NullableValue<kj::HttpHeaderId> *)local_2e0);
  _::NullableValue<kj::HttpHeaderId>::NullableValue
            ((NullableValue<kj::HttpHeaderId> *)((long)&_kj_result.field_1 + 8),pNVar4);
  _::NullableValue<kj::HttpHeaderId>::~NullableValue((NullableValue<kj::HttpHeaderId> *)local_2e0);
  pHVar5 = _::NullableValue<kj::HttpHeaderId>::operator*
                     ((NullableValue<kj::HttpHeaderId> *)((long)&_kj_result.field_1 + 8));
  bVar1 = HttpHeaderId::operator==(pHVar5,(HttpHeaderId *)HttpHeaderId::DATE);
  _::NullableValue<kj::HttpHeaderId>::~NullableValue
            ((NullableValue<kj::HttpHeaderId> *)((long)&_kj_result.field_1 + 8));
  if (!bVar1) {
    local_311 = _::Debug::shouldLog(ERROR);
    while (local_311 != false) {
      _::Debug::log<char_const(&)[84]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x68,ERROR,
                 "\"failed: expected \" \"KJ_ASSERT_NONNULL(table->stringToId(\\\"Date\\\")) == HttpHeaderId::DATE\""
                 ,(char (*) [84])
                  "failed: expected KJ_ASSERT_NONNULL(table->stringToId(\"Date\")) == HttpHeaderId::DATE"
                );
      local_311 = false;
    }
  }
  pHVar3 = Own<kj::HttpHeaderTable>::operator->((Own<kj::HttpHeaderTable> *)&_kj_shouldLog_3);
  StringPtr::StringPtr((StringPtr *)&local_370,"dATE");
  HttpHeaderTable::stringToId(&local_360,pHVar3,(StringPtr)local_370);
  pNVar4 = _::readMaybe<kj::HttpHeaderId>(&local_360);
  _::NullableValue<kj::HttpHeaderId>::NullableValue
            ((NullableValue<kj::HttpHeaderId> *)local_348,pNVar4);
  Maybe<kj::HttpHeaderId>::~Maybe(&local_360);
  pHVar5 = _::NullableValue::operator_cast_to_HttpHeaderId_((NullableValue *)local_348);
  if (pHVar5 == (HttpHeaderId *)0x0) {
    _::Debug::Fault::Fault
              ((Fault *)&stack0xfffffffffffffc88,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x69,FAILED,"table->stringToId(\"dATE\") != nullptr","");
    _::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffc88);
  }
  pNVar4 = mv<kj::_::NullableValue<kj::HttpHeaderId>>((NullableValue<kj::HttpHeaderId> *)local_348);
  _::NullableValue<kj::HttpHeaderId>::NullableValue
            ((NullableValue<kj::HttpHeaderId> *)((long)&_kj_result_1.field_1 + 8),pNVar4);
  _::NullableValue<kj::HttpHeaderId>::~NullableValue((NullableValue<kj::HttpHeaderId> *)local_348);
  pHVar5 = _::NullableValue<kj::HttpHeaderId>::operator*
                     ((NullableValue<kj::HttpHeaderId> *)((long)&_kj_result_1.field_1 + 8));
  bVar1 = HttpHeaderId::operator==(pHVar5,(HttpHeaderId *)HttpHeaderId::DATE);
  _::NullableValue<kj::HttpHeaderId>::~NullableValue
            ((NullableValue<kj::HttpHeaderId> *)((long)&_kj_result_1.field_1 + 8));
  if (!bVar1) {
    local_379 = _::Debug::shouldLog(ERROR);
    while (local_379 != false) {
      _::Debug::log<char_const(&)[84]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x69,ERROR,
                 "\"failed: expected \" \"KJ_ASSERT_NONNULL(table->stringToId(\\\"dATE\\\")) == HttpHeaderId::DATE\""
                 ,(char (*) [84])
                  "failed: expected KJ_ASSERT_NONNULL(table->stringToId(\"dATE\")) == HttpHeaderId::DATE"
                );
      local_379 = false;
    }
  }
  pHVar3 = Own<kj::HttpHeaderTable>::operator->((Own<kj::HttpHeaderTable> *)&_kj_shouldLog_3);
  StringPtr::StringPtr((StringPtr *)&local_3d8,"Foo-Bar");
  HttpHeaderTable::stringToId(&local_3c8,pHVar3,(StringPtr)local_3d8);
  pNVar4 = _::readMaybe<kj::HttpHeaderId>(&local_3c8);
  _::NullableValue<kj::HttpHeaderId>::NullableValue
            ((NullableValue<kj::HttpHeaderId> *)local_3b0,pNVar4);
  Maybe<kj::HttpHeaderId>::~Maybe(&local_3c8);
  pHVar5 = _::NullableValue::operator_cast_to_HttpHeaderId_((NullableValue *)local_3b0);
  if (pHVar5 == (HttpHeaderId *)0x0) {
    _::Debug::Fault::Fault
              ((Fault *)&stack0xfffffffffffffc20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x6a,FAILED,"table->stringToId(\"Foo-Bar\") != nullptr","");
    _::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffc20);
  }
  pNVar4 = mv<kj::_::NullableValue<kj::HttpHeaderId>>((NullableValue<kj::HttpHeaderId> *)local_3b0);
  _::NullableValue<kj::HttpHeaderId>::NullableValue
            ((NullableValue<kj::HttpHeaderId> *)((long)&_kj_result_2.field_1 + 8),pNVar4);
  _::NullableValue<kj::HttpHeaderId>::~NullableValue((NullableValue<kj::HttpHeaderId> *)local_3b0);
  pHVar5 = _::NullableValue<kj::HttpHeaderId>::operator*
                     ((NullableValue<kj::HttpHeaderId> *)((long)&_kj_result_2.field_1 + 8));
  bVar1 = HttpHeaderId::operator==(pHVar5,(HttpHeaderId *)auStack_a0);
  _::NullableValue<kj::HttpHeaderId>::~NullableValue
            ((NullableValue<kj::HttpHeaderId> *)((long)&_kj_result_2.field_1 + 8));
  if (!bVar1) {
    local_3e1 = _::Debug::shouldLog(ERROR);
    while (local_3e1 != false) {
      _::Debug::log<char_const(&)[75]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x6a,ERROR,
                 "\"failed: expected \" \"KJ_ASSERT_NONNULL(table->stringToId(\\\"Foo-Bar\\\")) == fooBar\""
                 ,(char (*) [75])
                  "failed: expected KJ_ASSERT_NONNULL(table->stringToId(\"Foo-Bar\")) == fooBar");
      local_3e1 = false;
    }
  }
  pHVar3 = Own<kj::HttpHeaderTable>::operator->((Own<kj::HttpHeaderTable> *)&_kj_shouldLog_3);
  StringPtr::StringPtr((StringPtr *)&local_440,"foo-BAR");
  HttpHeaderTable::stringToId(&local_430,pHVar3,(StringPtr)local_440);
  pNVar4 = _::readMaybe<kj::HttpHeaderId>(&local_430);
  _::NullableValue<kj::HttpHeaderId>::NullableValue
            ((NullableValue<kj::HttpHeaderId> *)local_418,pNVar4);
  Maybe<kj::HttpHeaderId>::~Maybe(&local_430);
  pHVar5 = _::NullableValue::operator_cast_to_HttpHeaderId_((NullableValue *)local_418);
  if (pHVar5 == (HttpHeaderId *)0x0) {
    _::Debug::Fault::Fault
              ((Fault *)&stack0xfffffffffffffbb8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x6b,FAILED,"table->stringToId(\"foo-BAR\") != nullptr","");
    _::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffbb8);
  }
  pNVar4 = mv<kj::_::NullableValue<kj::HttpHeaderId>>((NullableValue<kj::HttpHeaderId> *)local_418);
  _::NullableValue<kj::HttpHeaderId>::NullableValue
            ((NullableValue<kj::HttpHeaderId> *)((long)&_kj_result_3.field_1 + 8),pNVar4);
  _::NullableValue<kj::HttpHeaderId>::~NullableValue((NullableValue<kj::HttpHeaderId> *)local_418);
  pHVar5 = _::NullableValue<kj::HttpHeaderId>::operator*
                     ((NullableValue<kj::HttpHeaderId> *)((long)&_kj_result_3.field_1 + 8));
  bVar1 = HttpHeaderId::operator==(pHVar5,(HttpHeaderId *)auStack_a0);
  _::NullableValue<kj::HttpHeaderId>::~NullableValue
            ((NullableValue<kj::HttpHeaderId> *)((long)&_kj_result_3.field_1 + 8));
  if (!bVar1) {
    local_449 = _::Debug::shouldLog(ERROR);
    while (local_449 != false) {
      _::Debug::log<char_const(&)[75]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x6b,ERROR,
                 "\"failed: expected \" \"KJ_ASSERT_NONNULL(table->stringToId(\\\"foo-BAR\\\")) == fooBar\""
                 ,(char (*) [75])
                  "failed: expected KJ_ASSERT_NONNULL(table->stringToId(\"foo-BAR\")) == fooBar");
      local_449 = false;
    }
  }
  pHVar3 = Own<kj::HttpHeaderTable>::operator->((Own<kj::HttpHeaderTable> *)&_kj_shouldLog_3);
  StringPtr::StringPtr((StringPtr *)auStack_478,"foobar");
  HttpHeaderTable::stringToId(&local_468,pHVar3,(StringPtr)_auStack_478);
  bVar1 = Maybe<kj::HttpHeaderId>::operator==(&local_468,(void *)0x0);
  Maybe<kj::HttpHeaderId>::~Maybe(&local_468);
  if (!bVar1) {
    local_479 = _::Debug::shouldLog(ERROR);
    while (local_479 != false) {
      _::Debug::log<char_const(&)[56]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x6c,ERROR,
                 "\"failed: expected \" \"table->stringToId(\\\"foobar\\\") == nullptr\"",
                 (char (*) [56])"failed: expected table->stringToId(\"foobar\") == nullptr");
      local_479 = false;
    }
  }
  pHVar3 = Own<kj::HttpHeaderTable>::operator->((Own<kj::HttpHeaderTable> *)&_kj_shouldLog_3);
  StringPtr::StringPtr((StringPtr *)auStack_4a8,"barfoo");
  HttpHeaderTable::stringToId(&local_498,pHVar3,(StringPtr)_auStack_4a8);
  bVar1 = Maybe<kj::HttpHeaderId>::operator==(&local_498,(void *)0x0);
  Maybe<kj::HttpHeaderId>::~Maybe(&local_498);
  if (!bVar1) {
    local_4a9 = _::Debug::shouldLog(ERROR);
    while (local_4a9 != false) {
      _::Debug::log<char_const(&)[56]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x6d,ERROR,
                 "\"failed: expected \" \"table->stringToId(\\\"barfoo\\\") == nullptr\"",
                 (char (*) [56])"failed: expected table->stringToId(\"barfoo\") == nullptr");
      local_4a9 = false;
    }
  }
  Own<kj::HttpHeaderTable>::~Own((Own<kj::HttpHeaderTable> *)&_kj_shouldLog_3);
  HttpHeaderTable::Builder::~Builder((Builder *)&host.id);
  return;
}

Assistant:

TEST(AsyncUnixTest, Signals) {
  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  kill(getpid(), SIGURG);

  siginfo_t info = port.onSignal(SIGURG).wait(waitScope);
  EXPECT_EQ(SIGURG, info.si_signo);
  EXPECT_SI_CODE(SI_USER, info.si_code);
}